

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O2

int TVMFuncCreateFromCFunc
              (TVMPackedCFunc func,void *resource_handle,TVMPackedCFuncFinalizer fin,
              TVMFunctionHandle *out)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *pfVar3;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> _Stack_90;
  shared_ptr<void> rpack;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  if (fin == (TVMPackedCFuncFinalizer)0x0) {
    pfVar3 = (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
             operator_new(0x20);
    local_28 = std::
               _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc:509:9)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc:509:9)>
               ::_M_manager;
    local_40._M_unused._0_8_ = (undefined8)func;
    local_40._8_8_ = resource_handle;
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
              (pfVar3,(function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
                      &local_40);
    *out = pfVar3;
    std::_Function_base::~_Function_base((_Function_base *)&local_40);
  }
  else {
    std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<void,void(*)(void*),void>
              ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&rpack,resource_handle,fin);
    pfVar3 = (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
             operator_new(0x20);
    std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_90,&rpack.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
    local_58 = (code *)0x0;
    pcStack_50 = (code *)0x0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_68._M_unused._M_object = operator_new(0x18);
    _Var2._M_pi = _Stack_90._M_refcount._M_pi;
    peVar1 = _Stack_90._M_ptr;
    _Stack_90._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_90._M_ptr = (element_type *)0x0;
    *(TVMPackedCFunc *)local_68._M_unused._0_8_ = func;
    *(element_type **)((long)local_68._M_unused._0_8_ + 8) = peVar1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_68._M_unused._0_8_ + 0x10) =
         _Var2._M_pi;
    pcStack_50 = std::
                 _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc:521:9)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc:521:9)>
               ::_M_manager;
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
              (pfVar3,(function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)
                      &local_68);
    *out = pfVar3;
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rpack.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return 0;
}

Assistant:

int TVMFuncCreateFromCFunc(TVMPackedCFunc func,
                           void* resource_handle,
                           TVMPackedCFuncFinalizer fin,
                           TVMFunctionHandle *out) {
  API_BEGIN();
  if (fin == nullptr) {
    *out = new PackedFunc(
        [func, resource_handle](TVMArgs args, TVMRetValue* rv) {
          int ret = func((TVMValue*)args.values, (int*)args.type_codes, // NOLINT(*)
                         args.num_args, rv, resource_handle);
          if (ret != 0) {
            throw dmlc::Error(TVMGetLastError() + ::dmlc::StackTrace());
          }
        });
  } else {
    // wrap it in a shared_ptr, with fin as deleter.
    // so fin will be called when the lambda went out of scope.
    std::shared_ptr<void> rpack(resource_handle, fin);
    *out = new PackedFunc(
        [func, rpack](TVMArgs args, TVMRetValue* rv) {
          int ret = func((TVMValue*)args.values, (int*)args.type_codes, // NOLINT(*)
                         args.num_args, rv, rpack.get());
          if (ret != 0) {
            throw dmlc::Error(TVMGetLastError() + ::dmlc::StackTrace());
          }
      });
  }
  API_END();
}